

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldGenerator::GenerateMergingCode
          (ImmutableEnumOneofFieldGenerator *this,Printer *printer)

{
  char *text;
  
  text = "set$capitalized_name$(other.get$capitalized_name$());\n";
  if (*(int *)(*(long *)((this->super_ImmutableEnumFieldGenerator).descriptor_ + 0x30) + 0x8c) == 3)
  {
    text = "set$capitalized_name$Value(other.get$capitalized_name$Value());\n";
  }
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "set$capitalized_name$Value(other.get$capitalized_name$Value());\n");
  } else {
    printer->Print(variables_,
      "set$capitalized_name$(other.get$capitalized_name$());\n");
  }
}